

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItemEffectSourcePrivate::paddedEffectRect
          (QRectF *__return_storage_ptr__,QGraphicsItemEffectSourcePrivate *this,
          CoordinateSystem system,PixmapPadMode mode,QRectF *sourceRect,bool *unpadded)

{
  QGraphicsEffect *pQVar1;
  double dVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QSizeF local_c8;
  qreal local_b8;
  qreal qStack_b0;
  qreal local_a8;
  qreal qStack_a0;
  qreal local_98;
  qreal qStack_90;
  QSizeF local_88 [5];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->w = 0.0;
  __return_storage_ptr__->h = 0.0;
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
  if (unpadded != (bool *)0x0) {
    *unpadded = false;
  }
  if (mode == PadToTransparentBorder) {
    dVar2 = sourceRect->yp;
    __return_storage_ptr__->xp = sourceRect->xp + -1.5;
    __return_storage_ptr__->yp = dVar2 + -1.5;
    dVar2 = sourceRect->h;
    __return_storage_ptr__->w = sourceRect->w + 1.5 + 1.5;
    __return_storage_ptr__->h = dVar2 + 1.5 + 1.5;
  }
  else if (mode == PadToEffectiveBoundingRect) {
    if (this->info == (QGraphicsItemPaintInfo *)0x0) {
      pQVar1 = ((this->item->d_ptr).d)->graphicsEffect;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (**(code **)(*(long *)pQVar1 + 0x60))(__return_storage_ptr__,pQVar1,sourceRect);
        return __return_storage_ptr__;
      }
      goto LAB_0057f9bc;
    }
    local_98 = -NAN;
    qStack_90 = -NAN;
    local_a8 = -NAN;
    qStack_a0 = -NAN;
    if (system == DeviceCoordinates) {
      local_a8 = sourceRect->xp;
      qStack_a0 = sourceRect->yp;
      local_98 = sourceRect->w;
      qStack_90 = sourceRect->h;
    }
    else {
      QPainter::worldTransform();
      QTransform::mapRect((QRectF *)&local_a8);
    }
    pQVar1 = ((this->item->d_ptr).d)->graphicsEffect;
    (**(code **)(*(long *)pQVar1 + 0x60))(__return_storage_ptr__,pQVar1,&local_a8);
    if (unpadded != (bool *)0x0) {
      local_88[0].wd = __return_storage_ptr__->w;
      local_88[0].ht = __return_storage_ptr__->h;
      local_c8.wd = sourceRect->w;
      local_c8.ht = sourceRect->h;
      bVar6 = qFuzzyCompare(local_88,&local_c8);
      *unpadded = bVar6;
    }
    if (system == LogicalCoordinates && this->info != (QGraphicsItemPaintInfo *)0x0) {
      QPainter::worldTransform();
      QTransform::inverted((bool *)local_88);
      QTransform::mapRect((QRectF *)&local_c8);
      __return_storage_ptr__->w = local_b8;
      __return_storage_ptr__->h = qStack_b0;
      __return_storage_ptr__->xp = local_c8.wd;
      __return_storage_ptr__->yp = local_c8.ht;
    }
  }
  else {
    qVar3 = sourceRect->xp;
    qVar4 = sourceRect->yp;
    qVar5 = sourceRect->h;
    __return_storage_ptr__->w = sourceRect->w;
    __return_storage_ptr__->h = qVar5;
    __return_storage_ptr__->xp = qVar3;
    __return_storage_ptr__->yp = qVar4;
    if (unpadded != (bool *)0x0) {
      *unpadded = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0057f9bc:
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemEffectSourcePrivate::paddedEffectRect(Qt::CoordinateSystem system, QGraphicsEffect::PixmapPadMode mode, const QRectF &sourceRect, bool *unpadded) const
{
    QRectF effectRectF;

    if (unpadded)
        *unpadded = false;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect) {
        if (info) {
            QRectF deviceRect = system == Qt::DeviceCoordinates ? sourceRect : info->painter->worldTransform().mapRect(sourceRect);
            effectRectF = item->graphicsEffect()->boundingRectFor(deviceRect);
            if (unpadded)
                *unpadded = (effectRectF.size() == sourceRect.size());
            if (info && system == Qt::LogicalCoordinates)
                effectRectF = info->painter->worldTransform().inverted().mapRect(effectRectF);
        } else {
            // no choice but to send a logical coordinate bounding rect to boundingRectFor
            effectRectF = item->graphicsEffect()->boundingRectFor(sourceRect);
        }
    } else if (mode == QGraphicsEffect::PadToTransparentBorder) {
        // adjust by 1.5 to account for cosmetic pens
        effectRectF = sourceRect.adjusted(-1.5, -1.5, 1.5, 1.5);
    } else {
        effectRectF = sourceRect;
        if (unpadded)
            *unpadded = true;
    }

    return effectRectF;
}